

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.cpp
# Opt level: O1

MetadataResult PrintArguments(ShellState *state,char **azArg,idx_t nArg)

{
  ulong uVar1;
  
  if (1 < nArg) {
    uVar1 = 1;
    do {
      if (1 < uVar1) {
        fputc(0x20,(FILE *)state->out);
      }
      fputs(azArg[uVar1],(FILE *)state->out);
      uVar1 = uVar1 + 1;
    } while (nArg != uVar1);
  }
  fputc(10,(FILE *)state->out);
  return SUCCESS;
}

Assistant:

MetadataResult PrintArguments(ShellState &state, const char **azArg, idx_t nArg) {
	for (idx_t i = 1; i < nArg; i++) {
		if (i > 1) {
			raw_printf(state.out, " ");
		}
		utf8_printf(state.out, "%s", azArg[i]);
	}
	raw_printf(state.out, "\n");
	return MetadataResult::SUCCESS;
}